

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsByteCodeGenerator.cpp
# Opt level: O3

EmitExpressionInfo __thiscall
Js::AsmJSByteCodeGenerator::EmitUnaryLogNot(AsmJSByteCodeGenerator *this,ParseNode *pnode)

{
  AsmJsByteCodeWriter *this_00;
  AsmJsFunc *pAVar1;
  bool bVar2;
  Types type;
  ParseNodeUni *pPVar3;
  RegisterSpace *pRVar4;
  EmitExpressionInfo EVar5;
  AsmJsCompilationException *this_01;
  ParseNodePtr this_02;
  OpCodeAsmJs OVar6;
  EmitExpressionInfo local_38;
  
  pPVar3 = ParseNode::AsParseNodeUni(pnode);
  this_02 = pPVar3->pnode1;
  OVar6 = LogNot_Int;
  if (this_02->nop == knopLogNot) {
    OVar6 = EndOfBlock;
    do {
      pPVar3 = ParseNode::AsParseNodeUni(this_02);
      this_02 = pPVar3->pnode1;
      OVar6 = OVar6 + ExtendedOpcodePrefix;
    } while (this_02->nop == knopLogNot);
    OVar6 = OVar6 & ExtendedOpcodePrefix | LogNot_Int;
  }
  local_38 = Emit(this,this_02);
  this_00 = &this->mWriter;
  ByteCodeWriter::StartStatement(&this_00->super_ByteCodeWriter,pnode,0);
  bVar2 = AsmJsType::isInt(&local_38.type);
  if (bVar2) {
    pAVar1 = this->mFunction;
    type = WAsmJs::FromPrimitiveType<int>();
    pRVar4 = WAsmJs::TypedRegisterAllocator::GetRegisterSpace(&pAVar1->mTypedRegisterAllocator,type)
    ;
    if ((local_38.super_EmitInfoBase.location != 0xffffffff) &&
       (local_38.super_EmitInfoBase.location < pRVar4->mRegisterCount)) {
      EVar5.super_EmitInfoBase.location = GetAndReleaseUnaryLocations<int>(this,&local_38);
      AsmJsByteCodeWriter::AsmReg2
                (this_00,OVar6,EVar5.super_EmitInfoBase.location,
                 local_38.super_EmitInfoBase.location);
      ByteCodeWriter::EndStatement(&this_00->super_ByteCodeWriter,pnode);
      EVar5.type.which_ = Int;
      return EVar5;
    }
    this_01 = (AsmJsCompilationException *)__cxa_allocate_exception(0x200);
    AsmJsCompilationException::AsmJsCompilationException
              (this_01,L"Invalid Node location[%d] ",(ulong)local_38 & 0xffffffff);
  }
  else {
    this_01 = (AsmJsCompilationException *)__cxa_allocate_exception(0x200);
    AsmJsCompilationException::AsmJsCompilationException(this_01,L"Type not supported for unary !");
  }
  __cxa_throw(this_01,&AsmJsCompilationException::typeinfo,0);
}

Assistant:

Js::EmitExpressionInfo AsmJSByteCodeGenerator::EmitUnaryLogNot( ParseNode * pnode )
    {
        ParseNode* rhs = ParserWrapper::GetUnaryNode( pnode );
        int count = 1;
        while( rhs->nop == knopLogNot )
        {
            ++count;
            rhs = ParserWrapper::GetUnaryNode( rhs );
        }

        const EmitExpressionInfo& rhsEmit = Emit( rhs );
        const AsmJsType& rType = rhsEmit.type;
        StartStatement(pnode);
        EmitExpressionInfo emitInfo( AsmJsType::Int );
        if( rType.isInt() )
        {
            CheckNodeLocation( rhsEmit, int );
            RegSlot dst = GetAndReleaseUnaryLocations<int>( &rhsEmit );
            if( count & 1 )
            {
                // do the conversion only if we have an odd number of the operator
                mWriter.AsmReg2( OpCodeAsmJs::LogNot_Int, dst, rhsEmit.location );
            }
            else
            {
                // otherwise, make sure the result is 0|1
                mWriter.AsmReg2( OpCodeAsmJs::Conv_ITB, dst, rhsEmit.location );
            }
            emitInfo.location = dst;
        }
        else
        {
            throw AsmJsCompilationException( _u("Type not supported for unary !") );
        }
        EndStatement(pnode);
        return emitInfo;
    }